

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

LogicalExpr * __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>
::ReadLogicalExpr_abi_cxx11_
          (LogicalExpr *__return_storage_ptr__,
          NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>
          *this)

{
  BinaryReaderBase *this_00;
  char *pcVar1;
  int opcode;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_20;
  
  local_20.field_1.values_ = (Value *)&local_38;
  this_00 = *(BinaryReaderBase **)this;
  pcVar1 = (this_00->super_ReaderBase).ptr_;
  (this_00->super_ReaderBase).token_ = pcVar1;
  (this_00->super_ReaderBase).ptr_ = pcVar1 + 1;
  switch(*pcVar1) {
  case 'l':
  case 'n':
  case 's':
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
    ::ReadConstant((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                    *)this,*pcVar1);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    break;
  default:
    local_38 = 0;
    uStack_30 = 0;
    local_20.types_ = 0;
    BinaryReaderBase::ReportError(this_00,(CStringRef)0x139fc1,&local_20);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    break;
  case 'o':
    opcode = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
             ::ReadOpCode((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                           *)this);
    ReadLogicalExpr_abi_cxx11_(__return_storage_ptr__,this,opcode);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

typename Handler::LogicalExpr NLReader<Reader, Handler>::ReadLogicalExpr() {
  switch (char c = reader_.ReadChar()) {
  case 'n': case 'l': case 's':
    return handler_.OnBool(ReadConstant(c) != 0);
  case 'o':
    return ReadLogicalExpr(ReadOpCode());
  }
  reader_.ReportError("expected logical expression");
  return LogicalExpr();
}